

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fixSelectCb(Walker *p,Select *pSelect)

{
  DbFixer *pDVar1;
  sqlite3 *db;
  SrcList *pSVar2;
  char *zName;
  long lVar3;
  ushort uVar4;
  int iVar5;
  int iVar6;
  byte bVar7;
  long lVar8;
  long lVar9;
  ushort *puVar10;
  
  pDVar1 = (p->u).pFix;
  db = pDVar1->pParse->db;
  iVar5 = sqlite3FindDbName(db,pDVar1->zDb);
  pSVar2 = pSelect->pSrc;
  if (pSVar2 != (SrcList *)0x0) {
    puVar10 = (ushort *)&pSVar2->a[0].fg.field_0x1;
    for (lVar8 = 0; lVar8 < pSVar2->nSrc; lVar8 = lVar8 + 1) {
      if ((pDVar1->bTemp == '\0') && (uVar4 = *puVar10, (uVar4 & 4) == 0)) {
        bVar7 = (byte)puVar10[1];
        if (((bVar7 & 1) == 0) && (zName = *(char **)((long)puVar10 + 0x27), zName != (char *)0x0))
        {
          iVar6 = sqlite3FindDbName(db,zName);
          if (iVar5 != iVar6) {
            sqlite3ErrorMsg(pDVar1->pParse,"%s %T cannot reference objects in database %s",
                            pDVar1->zType,pDVar1->pName,zName);
            return 2;
          }
          sqlite3DbFree(db,zName);
          uVar4 = *puVar10 | 0x400;
          *puVar10 = uVar4;
          bVar7 = (byte)puVar10[1] | 2;
          *(byte *)(puVar10 + 1) = bVar7;
        }
        *(Schema **)((long)puVar10 + 0x27) = pDVar1->pSchema;
        *puVar10 = uVar4 | 0x100;
        *(byte *)(puVar10 + 1) = bVar7 | 1;
      }
      if (((*puVar10 & 0x800) == 0) &&
         (iVar6 = sqlite3WalkExpr(&pDVar1->w,*(Expr **)((long)puVar10 + 0x1f)), iVar6 != 0)) {
        return 2;
      }
      puVar10 = puVar10 + 0x24;
    }
    if (pSelect->pWith != (With *)0x0) {
      lVar8 = 0x20;
      lVar9 = -1;
      while( true ) {
        lVar9 = lVar9 + 1;
        if (pSelect->pWith->nCte <= lVar9) break;
        lVar3 = lVar8 + -0x10;
        lVar8 = lVar8 + 0x30;
        iVar5 = sqlite3WalkSelect(p,*(Select **)((long)pSelect->pWith->a + lVar3));
        if (iVar5 != 0) {
          return 2;
        }
      }
    }
  }
  return 0;
}

Assistant:

static int fixSelectCb(Walker *p, Select *pSelect){
  DbFixer *pFix = p->u.pFix;
  int i;
  SrcItem *pItem;
  sqlite3 *db = pFix->pParse->db;
  int iDb = sqlite3FindDbName(db, pFix->zDb);
  SrcList *pList = pSelect->pSrc;

  if( NEVER(pList==0) ) return WRC_Continue;
  for(i=0, pItem=pList->a; i<pList->nSrc; i++, pItem++){
    if( pFix->bTemp==0 && pItem->fg.isSubquery==0 ){
      if( pItem->fg.fixedSchema==0 && pItem->u4.zDatabase!=0 ){
        if( iDb!=sqlite3FindDbName(db, pItem->u4.zDatabase) ){
          sqlite3ErrorMsg(pFix->pParse,
              "%s %T cannot reference objects in database %s",
              pFix->zType, pFix->pName, pItem->u4.zDatabase);
          return WRC_Abort;
        }
        sqlite3DbFree(db, pItem->u4.zDatabase);
        pItem->fg.notCte = 1;
        pItem->fg.hadSchema = 1;
      }
      pItem->u4.pSchema = pFix->pSchema;
      pItem->fg.fromDDL = 1;
      pItem->fg.fixedSchema = 1;
    }
#if !defined(SQLITE_OMIT_VIEW) || !defined(SQLITE_OMIT_TRIGGER)
    if( pList->a[i].fg.isUsing==0
     && sqlite3WalkExpr(&pFix->w, pList->a[i].u3.pOn)
    ){
      return WRC_Abort;
    }
#endif
  }
  if( pSelect->pWith ){
    for(i=0; i<pSelect->pWith->nCte; i++){
      if( sqlite3WalkSelect(p, pSelect->pWith->a[i].pSelect) ){
        return WRC_Abort;
      }
    }
  }
  return WRC_Continue;
}